

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * icu_63::CollationLoader::loadTailoring(Locale *locale,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  CollationCacheEntry *pCVar3;
  undefined1 local_240 [8];
  CollationLoader loader;
  char *name;
  CollationCacheEntry *rootEntry;
  UErrorCode *errorCode_local;
  Locale *locale_local;
  
  locale_local = (Locale *)CollationRoot::getRootCacheEntry(errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    loader.data = (UResourceBundle *)Locale::getName(locale);
    if ((*(char *)&(loader.data)->fKey != '\0') &&
       (iVar2 = strcmp((char *)loader.data,"root"), iVar2 != 0)) {
      *errorCode = U_ZERO_ERROR;
      CollationLoader((CollationLoader *)local_240,(CollationCacheEntry *)locale_local,locale,
                      errorCode);
      pCVar3 = getCacheEntry((CollationLoader *)local_240,errorCode);
      ~CollationLoader((CollationLoader *)local_240);
      return pCVar3;
    }
    SharedObject::addRef((SharedObject *)locale_local);
  }
  else {
    locale_local = (Locale *)0x0;
  }
  return (CollationCacheEntry *)locale_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadTailoring(const Locale &locale, UErrorCode &errorCode) {
    const CollationCacheEntry *rootEntry = CollationRoot::getRootCacheEntry(errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    const char *name = locale.getName();
    if(*name == 0 || uprv_strcmp(name, "root") == 0) {

        // Have to add a ref.
        rootEntry->addRef();
        return rootEntry;
    }

    // Clear warning codes before loading where they get cached.
    errorCode = U_ZERO_ERROR;
    CollationLoader loader(rootEntry, locale, errorCode);

    // getCacheEntry adds a ref for us.
    return loader.getCacheEntry(errorCode);
}